

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O3

CSTOverlay * __thiscall
r_exec::CSTOverlay::get_offspring
          (CSTOverlay *this,HLPBindingMap *map,_Fact *input,_Fact *bound_pattern)

{
  atomic_int_fast64_t *paVar1;
  CSTOverlay *this_00;
  uint64_t uVar2;
  _Fact *bound_pattern_00;
  _Fact *local_30;
  
  bound_pattern_00 = bound_pattern;
  this_00 = (CSTOverlay *)operator_new(0x148);
  CSTOverlay(this_00,this);
  if (bound_pattern != (_Fact *)0x0) {
    LOCK();
    paVar1 = &(bound_pattern->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_30 = bound_pattern;
  r_code::list<core::P<r_exec::_Fact>_>::remove
            (&(this->super_HLPOverlay).patterns,(char *)&local_30);
  if (local_30 != (_Fact *)0x0) {
    LOCK();
    paVar1 = &(local_30->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
              .super_Code.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if ((local_30->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object.refCount.super___atomic_base<long>._M_i < 1) {
      (*(local_30->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[1])();
    }
  }
  if (this->match_deadline == 0) {
    uVar2 = BindingMap::get_fwd_before(&map->super_BindingMap);
    this->match_deadline = uVar2;
  }
  update(this,map,input,bound_pattern_00);
  return this_00;
}

Assistant:

CSTOverlay *CSTOverlay::get_offspring(HLPBindingMap *map, _Fact *input, _Fact *bound_pattern)
{
    CSTOverlay *offspring = new CSTOverlay(this);
    patterns.remove(bound_pattern);

    if (match_deadline == 0) {
        match_deadline = map->get_fwd_before();
    }

    update(map, input, bound_pattern);
    //std::cout<<std::hex<<this<<std::dec<<" produced: "<<std::hex<<offspring<<std::dec<<std::endl;
    return offspring;
}